

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatumSpecification.cpp
# Opt level: O2

bool __thiscall
DIS::DatumSpecification::operator==(DatumSpecification *this,DatumSpecification *rhs)

{
  pointer pFVar1;
  pointer pVVar2;
  bool bVar3;
  bool bVar4;
  size_t idx_1;
  long lVar5;
  size_t idx;
  ulong uVar6;
  
  bVar4 = true;
  lVar5 = 0;
  for (uVar6 = 0;
      pFVar1 = (this->_fixedDatumIDList).
               super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar6 < (ulong)((long)(this->_fixedDatumIDList).
                            super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pFVar1 >> 4);
      uVar6 = uVar6 + 1) {
    bVar3 = FixedDatum::operator==
                      ((FixedDatum *)((long)&pFVar1->_vptr_FixedDatum + lVar5),
                       (FixedDatum *)
                       ((long)&((rhs->_fixedDatumIDList).
                                super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_vptr_FixedDatum + lVar5
                       ));
    bVar4 = (bool)(bVar4 & bVar3);
    lVar5 = lVar5 + 0x10;
  }
  lVar5 = 0;
  for (uVar6 = 0;
      pVVar2 = (this->_variableDatumIDList).
               super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar6 < (ulong)(((long)(this->_variableDatumIDList).
                             super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2) / 0x30);
      uVar6 = uVar6 + 1) {
    bVar3 = VariableDatum::operator==
                      ((VariableDatum *)((long)&pVVar2->_vptr_VariableDatum + lVar5),
                       (VariableDatum *)
                       ((long)&((rhs->_variableDatumIDList).
                                super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_vptr_VariableDatum +
                       lVar5));
    bVar4 = (bool)(bVar4 & bVar3);
    lVar5 = lVar5 + 0x30;
  }
  return bVar4;
}

Assistant:

bool DatumSpecification::operator ==(const DatumSpecification& rhs) const
 {
     bool ivarsEqual = true;


     for(size_t idx = 0; idx < _fixedDatumIDList.size(); idx++)
     {
        if( ! ( _fixedDatumIDList[idx] == rhs._fixedDatumIDList[idx]) ) ivarsEqual = false;
     }


     for(size_t idx = 0; idx < _variableDatumIDList.size(); idx++)
     {
        if( ! ( _variableDatumIDList[idx] == rhs._variableDatumIDList[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }